

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::sub_c(CPU *this)

{
  CPU *this_local;
  
  sub_r8(this,this->regs->c);
  return 1;
}

Assistant:

int CPU::sub_c() {
    sub_r8(regs.c);
    return 1;
}